

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

int __thiscall QObject::startTimer(QObject *this,milliseconds time,TimerType timerType)

{
  int iVar1;
  nanoseconds interval;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  interval.__r = time.__r * 1000000;
  if (SEXT816(interval.__r) != SEXT816(time.__r) * SEXT416(1000000)) {
    local_38.context.version = 2;
    local_38.context.function._4_4_ = 0;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning
              (&local_38,
               "QObject::startTimer(std::chrono::milliseconds): \'time\' arg overflowed when converted to nanoseconds."
              );
    interval.__r = 0x7fffffffffffffff;
  }
  iVar1 = startTimer(this,interval,timerType);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QObject::startTimer(std::chrono::milliseconds time, Qt::TimerType timerType)
{
    using namespace std::chrono;
    using ratio = std::ratio_divide<std::milli, std::nano>;
    nanoseconds::rep r;
    if (qMulOverflow<ratio::num>(time.count(), &r)) {
        qWarning("QObject::startTimer(std::chrono::milliseconds): "
                 "'time' arg overflowed when converted to nanoseconds.");
        r = nanoseconds::max().count();
    }
    return startTimer(nanoseconds{r}, timerType);
}